

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGImpactShape.h
# Opt level: O1

void __thiscall btGImpactMeshShapePart::TrimeshPrimitiveManager::lock(TrimeshPrimitiveManager *this)

{
  int iVar1;
  
  if (*(int *)(this + 0x2c) < 1) {
    (**(code **)(**(long **)(this + 0x10) + 0x20))
              (*(long **)(this + 0x10),this + 0x30,this + 0x38,this + 0x3c,this + 0x40,this + 0x48,
               this + 0x50,this + 0x54,this + 0x58,*(undefined4 *)(this + 0x28));
    iVar1 = 1;
  }
  else {
    iVar1 = *(int *)(this + 0x2c) + 1;
  }
  *(int *)(this + 0x2c) = iVar1;
  return;
}

Assistant:

void lock()
		{
			if(m_lock_count>0)
			{
				m_lock_count++;
				return;
			}
			m_meshInterface->getLockedReadOnlyVertexIndexBase(
				&vertexbase,numverts,
				type, stride,&indexbase, indexstride, numfaces,indicestype,m_part);

			m_lock_count = 1;
		}